

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::iterate(FunctionalTest *this)

{
  ostringstream *poVar1;
  GLenum condition_mode_or_query_target;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ContextType ctxType;
  int iVar5;
  deUint32 err;
  undefined4 extraout_var;
  size_t sVar6;
  undefined4 extraout_var_00;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  TestContext *this_00;
  uint uVar10;
  long lVar11;
  GLfloat GVar12;
  float fVar13;
  float fVar14;
  float local_1d4;
  long local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_conditional_render_inverted");
  if ((bVar2) || (bVar3)) {
    createProgram(this);
    createView(this);
    createVertexArrayObject(this);
    bVar2 = true;
    local_1d0 = 0;
    do {
      lVar7 = 0;
      do {
        pcVar8 = "unknow mode";
        if (lVar7 == 0) {
          pcVar8 = "GL_SAMPLES_PASSED";
        }
        if (lVar7 == 1) {
          pcVar8 = "GL_ANY_SAMPLES_PASSED";
        }
        lVar11 = 0;
        do {
          createQueryObject(this);
          setupColor(this,1.0);
          bVar3 = iterate::render_cases[local_1d0];
          setupPassSwitch(this,bVar3);
          iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var,iVar5) + 0x188))(0x4000);
          err = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
          glu::checkError(err,"glClear() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                          ,0x2ba);
          draw(this,false,iterate::query_cases[lVar7]);
          bVar4 = fragmentsPassed(this);
          if (bVar3 == bVar4) {
            setupColor(this,0.0);
            setupPassSwitch(this,true);
            condition_mode_or_query_target =
                 *(GLenum *)((long)CoverageTest::iterate::modes + lVar11);
            draw(this,true,condition_mode_or_query_target);
            local_1d4 = 1.0;
            if (bVar3 == false) {
              local_1d4 = 0.0;
            }
            GVar12 = readPixel(this);
            fVar14 = local_1d4 - GVar12;
            fVar13 = -fVar14;
            if (-fVar14 <= fVar14) {
              fVar13 = fVar14;
            }
            if (0.0078125 < fVar13) {
              local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"The functional test\'s expected value (",0x26);
              std::ostream::_M_insert<double>((double)local_1d4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,") is different than resulted value (",0x24);
              std::ostream::_M_insert<double>((double)GVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"). The tested mode was ",0x17);
              uVar10 = condition_mode_or_query_target - 0x8e17;
              pcVar9 = "unknow mode";
              if (uVar10 < 4) {
                pcVar9 = (&PTR_anon_var_dwarf_35c0ea_021190c8)[uVar10];
              }
              sVar6 = strlen(pcVar9);
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar9,sVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,". Query was done for target ",0x1c);
              sVar6 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar8,sVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", and the test was prepared to ",0x1f);
              pcVar9 = "discard";
              if (bVar3 != false) {
                pcVar9 = "pass";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,pcVar9,(ulong)(bVar3 ^ 1) * 3 + 4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1," all fragments.",0xf);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              goto LAB_00927769;
            }
          }
          else {
LAB_00927769:
            bVar2 = false;
          }
          iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
          if (this->m_qo_id != 0) {
            (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x458))(1);
            this->m_qo_id = 0;
          }
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x10);
        bVar3 = lVar7 == 0;
        lVar7 = lVar7 + 1;
      } while (bVar3);
      bVar3 = local_1d0 == 0;
      local_1d0 = local_1d0 + 1;
    } while (bVar3);
  }
  else {
    bVar2 = true;
  }
  cleanProgramViewAndVAO(this);
  if (!bVar2) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"The Conditional Render Inverted Functional Test has failed.",0x3b)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar8 = "Fail.";
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult(this_00,(uint)!bVar2,pcVar8);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl4cts::ConditionalRenderInverted::FunctionalTest::iterate()
{
	/* OpenGL support query. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_conditional_render_inverted =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_conditional_render_inverted");

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* This test should only be executed if we're running a GL4.5 context or related extension is available */
	try
	{
		if (is_at_least_gl_45 || is_arb_conditional_render_inverted)
		{
			/* Test cases. */
			static const bool render_cases[] = { false, true };

			static const glw::GLuint render_cases_count = sizeof(render_cases) / sizeof(render_cases[0]);

			static const glw::GLenum query_cases[] = { GL_SAMPLES_PASSED, GL_ANY_SAMPLES_PASSED };

			static const glw::GLuint query_cases_count = sizeof(query_cases) / sizeof(query_cases[0]);

			static const glw::GLenum modes[] = { GL_QUERY_WAIT_INVERTED, GL_QUERY_NO_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_NO_WAIT_INVERTED };

			static const glw::GLuint modes_count = sizeof(modes) / sizeof(modes[0]);

			/* Creating common objects. */
			createProgram();
			createView();
			createVertexArrayObject();

			/* Iterating over test cases. */
			for (glw::GLuint i = 0; i < render_cases_count; ++i)
			{
				for (glw::GLuint j = 0; j < query_cases_count; ++j)
				{
					for (glw::GLuint k = 0; k < modes_count; ++k)
					{
						createQueryObject();

						setupColor(1.f);
						setupPassSwitch(render_cases[i]);
						clearView();
						draw(false, query_cases[j]);

						if (render_cases[i] == fragmentsPassed())
						{
							setupColor(0.f);
							setupPassSwitch(true);
							draw(true, modes[k]);

							glw::GLfloat expected_value = (render_cases[i]) ? 1.f : 0.f;
							glw::GLfloat resulted_value = readPixel();

							if (de::abs(expected_value - resulted_value) > 0.0078125f /* Precission (1/128) */)
							{
								m_context.getTestContext().getLog()
									<< tcu::TestLog::Message << "The functional test's expected value ("
									<< expected_value << ") is different than resulted value (" << resulted_value
									<< "). The tested mode was " << Utilities::modeToChars(modes[k])
									<< ". Query was done for target " << Utilities::queryTargetToChars(query_cases[j])
									<< ", and the test was prepared to " << ((render_cases[i]) ? "pass" : "discard")
									<< " all fragments." << tcu::TestLog::EndMessage;

								is_ok = false;
							}
						}
						else
						{
							is_ok = false;
						}

						cleanQueryObject();
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		cleanQueryObject();
	}

	/* Clean-up. */
	cleanProgramViewAndVAO();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Internal error has occured during Conditional Render Inverted Functional Test."
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Test error.");
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "The Conditional Render Inverted Functional Test has failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail.");
		}
	}

	return STOP;
}